

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

int Wlc_NtkCreateLevels_(Wlc_Ntk_t *p)

{
  Wlc_Obj_t *pWVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar9;
  
  uVar2 = p->iObj;
  if ((p->vLevels).nCap < (int)uVar2) {
    piVar4 = (p->vLevels).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar2 << 2);
    }
    (p->vLevels).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vLevels).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset((p->vLevels).pArray,0,(ulong)uVar2 * 4);
  }
  (p->vLevels).nSize = uVar2;
  iVar3 = 0;
  if (1 < p->iObj) {
    iVar3 = 0;
    lVar5 = 1;
    do {
      if (p->nObjsAlloc <= lVar5) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      uVar2 = p->pObjs[lVar5].nFanins;
      if ((long)(int)uVar2 < 1) {
        iVar6 = 0;
      }
      else {
        pWVar1 = p->pObjs + lVar5;
        lVar7 = 0;
        iVar6 = 0;
        do {
          if ((2 < uVar2) ||
             (paVar9 = &pWVar1->field_10,
             (undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) ==
             (undefined1  [24])0x6)) {
            paVar9 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
          }
          iVar8 = paVar9->Fanins[lVar7];
          if (((long)iVar8 < 0) || ((p->vLevels).nSize <= iVar8)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar8 = (p->vLevels).pArray[iVar8] + 1;
          if (iVar6 <= iVar8) {
            iVar6 = iVar8;
          }
          lVar7 = lVar7 + 1;
        } while ((int)uVar2 != lVar7);
      }
      if ((p->vLevels).nSize <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      if (iVar3 <= iVar6) {
        iVar3 = iVar6;
      }
      (p->vLevels).pArray[lVar5] = iVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->iObj);
  }
  return iVar3;
}

Assistant:

int Wlc_NtkCreateLevels_( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, iFanin, Level, LevelMax = 0;
    Vec_IntFill( &p->vLevels, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        Level = 0;
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Level = Abc_MaxInt( Level, Wlc_ObjLevelId(p, iFanin) + 1 );
        Vec_IntWriteEntry( &p->vLevels, i, Level );
        LevelMax = Abc_MaxInt( LevelMax, Level );
    }
    return LevelMax;
}